

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3ExprCheckDepth(Fts3Expr *p,int nMaxDepth)

{
  int local_18;
  int rc;
  int nMaxDepth_local;
  Fts3Expr *p_local;
  
  local_18 = 0;
  if (p != (Fts3Expr *)0x0) {
    if (nMaxDepth < 0) {
      local_18 = 0x12;
    }
    else {
      local_18 = fts3ExprCheckDepth(p->pLeft,nMaxDepth + -1);
      if (local_18 == 0) {
        local_18 = fts3ExprCheckDepth(p->pRight,nMaxDepth + -1);
      }
    }
  }
  return local_18;
}

Assistant:

static int fts3ExprCheckDepth(Fts3Expr *p, int nMaxDepth){
  int rc = SQLITE_OK;
  if( p ){
    if( nMaxDepth<0 ){ 
      rc = SQLITE_TOOBIG;
    }else{
      rc = fts3ExprCheckDepth(p->pLeft, nMaxDepth-1);
      if( rc==SQLITE_OK ){
        rc = fts3ExprCheckDepth(p->pRight, nMaxDepth-1);
      }
    }
  }
  return rc;
}